

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O0

void __thiscall wasm::GenerateDynCalls::visitFunction(GenerateDynCalls *this,Function *func)

{
  pointer *this_00;
  bool bVar1;
  Tuple local_c0;
  Type local_a8;
  Signature local_a0;
  HeapType local_90 [3];
  allocator<wasm::Type> local_71;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_70;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_60;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_50;
  undefined1 local_40 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  Signature sig;
  Function *func_local;
  GenerateDynCalls *this_local;
  
  bVar1 = Importable::imported(&func->super_Importable);
  if (((bVar1) &&
      (bVar1 = IString::operator==(&(func->super_Importable).module.super_IString,(IString *)ENV),
      bVar1)) &&
     (bVar1 = IString::startsWith<8>
                        (&(func->super_Importable).base.super_IString,(char (*) [8])"invoke_"),
     bVar1)) {
    join_0x00000010_0x00000000_ = HeapType::getSignature(&func->type);
    this_00 = &newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_60 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::begin((Type *)this_00);
    local_50 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator+(&local_60,1)
    ;
    local_70 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)this_00);
    std::allocator<wasm::Type>::allocator(&local_71);
    std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_40,(Iterator)local_50,
               (Iterator)local_70,&local_71);
    std::allocator<wasm::Type>::~allocator(&local_71);
    Tuple::Tuple(&local_c0,(TypeList *)local_40);
    wasm::Type::Type(&local_a8,&local_c0);
    Signature::Signature(&local_a0,local_a8,sig.params);
    HeapType::HeapType(local_90,local_a0);
    InsertOrderedSet<wasm::HeapType>::insert(&this->invokeTypes,local_90);
    Tuple::~Tuple(&local_c0);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_40);
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    // Generate dynCalls for invokes
    if (func->imported() && func->module == ENV &&
        func->base.startsWith("invoke_")) {
      Signature sig = func->type.getSignature();
      // The first parameter is a pointer to the original function that's called
      // by the invoke, so skip it
      std::vector<Type> newParams(sig.params.begin() + 1, sig.params.end());
      invokeTypes.insert(Signature(Type(newParams), sig.results));
    }
  }